

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O1

QThread * __thiscall QNetworkAccessManagerPrivate::createThread(QNetworkAccessManagerPrivate *this)

{
  long lVar1;
  QThread *this_00;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->thread == (QThread *)0x0) {
    this_00 = (QThread *)operator_new(0x10);
    QThread::QThread(this_00,(QObject *)0x0);
    this->thread = this_00;
    QObject::doSetObjectName((QString *)this_00);
    QThread::start(this->thread,7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return this->thread;
}

Assistant:

QThread * QNetworkAccessManagerPrivate::createThread()
{
    if (!thread) {
        thread = new QThread;
        thread->setObjectName(QStringLiteral("QNetworkAccessManager thread"));
        thread->start();
    }
    Q_ASSERT(thread);
    return thread;
}